

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O2

void __thiscall
icu_63::HebrewCalendar::add
          (HebrewCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  bool bVar1;
  int32_t iVar2;
  int32_t value;
  int iVar3;
  int value_00;
  int iVar4;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (field == UCAL_MONTH) {
    iVar2 = Calendar::get(&this->super_Calendar,UCAL_MONTH,status);
    value = Calendar::get(&this->super_Calendar,UCAL_YEAR,status);
    value_00 = iVar2 + amount;
    if (amount < 1) {
      bVar1 = 5 < iVar2;
      iVar4 = value * 0xc + 0x11;
      while( true ) {
        if ((bVar1) && (value_00 < 6)) {
          iVar3 = 0xc;
          if (iVar4 % 0x13 < 0) {
            iVar3 = -7;
          }
          value_00 = value_00 - (uint)(iVar4 % 0x13 < iVar3);
        }
        if (-1 < value_00) break;
        value_00 = value_00 + 0xd;
        value = value + -1;
        iVar4 = iVar4 + -0xc;
        bVar1 = true;
      }
    }
    else {
      bVar1 = iVar2 < 5;
      iVar4 = value * 0xc + 0x11;
      while( true ) {
        if ((bVar1) && (4 < value_00)) {
          iVar3 = 0xc;
          if (iVar4 % 0x13 < 0) {
            iVar3 = -7;
          }
          value_00 = value_00 + (uint)(iVar4 % 0x13 < iVar3);
        }
        if (value_00 < 0xd) break;
        value_00 = value_00 + -0xd;
        value = value + 1;
        iVar4 = iVar4 + 0xc;
        bVar1 = true;
      }
    }
    Calendar::set(&this->super_Calendar,UCAL_MONTH,value_00);
    Calendar::set(&this->super_Calendar,UCAL_YEAR,value);
    (*(this->super_Calendar).super_UObject._vptr_UObject[0x2c])(this,5,status);
    return;
  }
  Calendar::add(&this->super_Calendar,field,amount,status);
  return;
}

Assistant:

UBool HebrewCalendar::haveDefaultCentury() const
{
    return TRUE;
}